

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O1

void amiga_setlnksym(GlobalVars *gv,Symbol *xdef)

{
  ObjectUnit *ou;
  LinkedSection *pLVar1;
  node *pnVar2;
  Section *n;
  char *name;
  
  if (((xdef->flags & 1) == 0) || (-1 < (int)xdef->extra)) {
    elf_setlnksym(gv,xdef);
    return;
  }
  switch(xdef->extra & 0x7fffffff) {
  case 0:
  case 1:
    pLVar1 = smalldata_section(gv);
    xdef->relsect = (Section *)(pLVar1->sections).first;
    goto switchD_0011ea73_default;
  case 2:
    name = ".sdata";
    break;
  case 3:
    name = ".sbss";
    break;
  case 4:
    pLVar1 = find_lnksec(gv,".sdata",'\0','\0','\0','\0');
    if (pLVar1 == (LinkedSection *)0x0) {
      pnVar2 = (node *)&gv->selobjects;
    }
    else {
      pnVar2 = (pLVar1->sections).first + 1;
    }
    ou = (ObjectUnit *)pnVar2->next;
    if (ou == (ObjectUnit *)0x0) {
      ierror("No object unit for ddrelocs section");
    }
    n = create_section(ou,ddrelocs_name,(uint8_t *)0x0,0);
    n->id = 0xffffffff;
    n->type = '\x02';
    n->flags = '\x01';
    n->protection = '\x01';
    n->alignment = '\x02';
    pLVar1 = create_lnksect(gv,n->name,'\x02','\x01','\x01','\x02',0);
    addtail(&pLVar1->sections,&n->n);
    n->lnksec = pLVar1;
    pLVar1->size = 1;
    n->size = 1;
    xdef->relsect = n;
    goto switchD_0011ea73_default;
  case 5:
    name = ".text";
    break;
  default:
    goto switchD_0011ea73_default;
  }
  pLVar1 = find_lnksec(gv,name,'\0','\0','\0','\0');
  if (pLVar1 != (LinkedSection *)0x0) {
    xdef->value = pLVar1->size;
  }
switchD_0011ea73_default:
  xdef->flags = xdef->flags & 0xfe;
  return;
}

Assistant:

static void amiga_setlnksym(struct GlobalVars *gv,struct Symbol *xdef)
{
  if ((xdef->flags & SYMF_LNKSYM) && (xdef->extra & SYMX_SPECIAL)) {
    struct LinkedSection *ls;

    switch (xdef->extra & ~SYMX_SPECIAL) {
      case LINKERDB:
      case R13INIT:
        ls = smalldata_section(gv);
        xdef->relsect = (struct Section *)ls->sections.first;
        break;
      case SDATASIZE:
        if (ls = find_lnksec(gv,sdata_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
      case SBSSSIZE:
        if (ls = find_lnksec(gv,sbss_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
      case DDRELOCS:
        xdef->relsect = ddrelocs_sec(gv,find_lnksec(gv,sdata_name,0,0,0,0));
        break;
      case TEXTSIZE:
        if (ls = find_lnksec(gv,text_name,0,0,0,0))
          xdef->value = (lword)ls->size;
        break;
    }
    xdef->flags &= ~SYMF_LNKSYM;  /* do not init again */
  }
  else
    elf_setlnksym(gv,xdef);
}